

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<int,(unsigned_char)4>>
          (Thread *this)

{
  Simd<short,_(unsigned_char)__b_> value;
  short sVar1;
  Simd<int,_(unsigned_char)__x04_> SVar2;
  byte local_42;
  byte local_41;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  u8 i_1;
  u8 i;
  Simd<short,_(unsigned_char)__b_> result;
  Simd<int,_(unsigned_char)__x04_> lhs;
  Simd<int,_(unsigned_char)__x04_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  SVar2 = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  result.v[4] = (short)SVar2.v[0];
  result.v[5] = (short)((uint)SVar2.v[0] >> 0x10);
  result.v[6] = (short)SVar2.v[1];
  result.v[7] = (short)((uint)SVar2.v[1] >> 0x10);
  lhs.v[0] = SVar2.v[2];
  lhs.v[1] = SVar2.v[3];
  for (local_41 = 0; local_41 < 4; local_41 = local_41 + 1) {
    sVar1 = Saturate<short,int>(lhs.v[(ulong)local_41 - 2]);
    *(short *)((long)lhs.v + (ulong)local_41 * 2 + -0x18) = sVar1;
  }
  for (local_42 = 0; local_42 < 4; local_42 = local_42 + 1) {
    sVar1 = Saturate<short,int>(lhs.v[(ulong)local_42 + 2]);
    *(short *)((long)lhs.v + (long)(int)(local_42 + 4) * 2 + -0x18) = sVar1;
  }
  value.v[4] = result.v[0];
  value.v[5] = result.v[1];
  value.v[6] = result.v[2];
  value.v[7] = result.v[3];
  value.v[0] = uStack_40;
  value.v[1] = uStack_3e;
  value.v[2] = uStack_3c;
  value.v[3] = _i_1;
  Push<wabt::interp::Simd<short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result.v[i] = Saturate<SL, TL>(lhs.v[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result.v[T::lanes + i] = Saturate<SL, TL>(rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}